

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqbaselib.cpp
# Opt level: O1

SQInteger array_resize(HSQUIRRELVM v)

{
  SQUnsignedInteger *pSVar1;
  SQObjectType SVar2;
  SQObjectValue SVar3;
  uint uVar4;
  SQDelegable *pSVar5;
  SQObjectPtr *pSVar6;
  SQObjectPtr *pSVar7;
  SQRESULT SVar8;
  SQInteger SVar9;
  SQObjectPtr *pSVar10;
  SQObjectPtr fill;
  SQObjectPtr local_28;
  
  pSVar6 = SQVM::GetAt(v,v->_stackbase);
  pSVar7 = SQVM::GetAt(v,v->_stackbase + 1);
  local_28.super_SQObject._unVal.pTable = (SQTable *)0x0;
  local_28.super_SQObject._type = OT_NULL;
  if (((pSVar7->super_SQObject)._type & 0x4000000) == 0) {
    SVar8 = sq_throwerror(v,"size must be a number");
  }
  else {
    SVar9 = sq_gettop(v);
    SVar3 = local_28.super_SQObject._unVal;
    if (2 < SVar9) {
      pSVar10 = SQVM::GetAt(v,v->_stackbase + 2);
      SVar3 = (SQObjectValue)(pSVar10->super_SQObject)._unVal.pTable;
      SVar2 = (pSVar10->super_SQObject)._type;
      if ((SVar2 >> 0x1b & 1) != 0) {
        pSVar1 = &((SVar3.pTable)->super_SQDelegable).super_SQCollectable.super_SQRefCounted._uiRef;
        *pSVar1 = *pSVar1 + 1;
      }
      uVar4 = local_28.super_SQObject._type >> 0x1b;
      local_28.super_SQObject._type = SVar2;
      if ((uVar4 & 1) != 0) {
        pSVar1 = &((local_28.super_SQObject._unVal.pTable)->super_SQDelegable).super_SQCollectable.
                  super_SQRefCounted._uiRef;
        *pSVar1 = *pSVar1 - 1;
        if (*pSVar1 == 0) {
          pSVar5 = &(local_28.super_SQObject._unVal.pTable)->super_SQDelegable;
          local_28.super_SQObject._unVal = SVar3;
          (*(pSVar5->super_SQCollectable).super_SQRefCounted._vptr_SQRefCounted[2])();
          SVar3 = local_28.super_SQObject._unVal;
        }
      }
    }
    local_28.super_SQObject._unVal = SVar3;
    if ((pSVar7->super_SQObject)._type == OT_FLOAT) {
      SVar9 = (SQInteger)(pSVar7->super_SQObject)._unVal.fFloat;
    }
    else {
      SVar9 = (pSVar7->super_SQObject)._unVal.nInteger;
    }
    SQArray::Resize((pSVar6->super_SQObject)._unVal.pArray,SVar9,&local_28);
    SVar8 = 0;
  }
  SQObjectPtr::~SQObjectPtr(&local_28);
  return SVar8;
}

Assistant:

static SQInteger array_resize(HSQUIRRELVM v)
{
    SQObject &o = stack_get(v, 1);
    SQObject &nsize = stack_get(v, 2);
    SQObjectPtr fill;
    if(sq_isnumeric(nsize)) {
        if(sq_gettop(v) > 2)
            fill = stack_get(v, 3);
        _array(o)->Resize(tointeger(nsize),fill);
        return 0;
    }
    return sq_throwerror(v, _SC("size must be a number"));
}